

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

size_t __thiscall
anon_unknown.dwarf_3697931::root_dir_start
          (anon_unknown_dwarf_3697931 *this,StringRef str,Style style)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  Style SVar4;
  size_t sVar5;
  char *Str;
  size_type sVar6;
  StringRef local_38;
  Style local_24;
  undefined1 auStack_20 [4];
  Style style_local;
  StringRef str_local;
  
  str_local.Data = str.Data;
  local_24 = (Style)str.Length;
  _auStack_20 = this;
  SVar4 = real_style(local_24);
  if (((SVar4 == windows) && (sVar5 = llvm::StringRef::size((StringRef *)auStack_20), 2 < sVar5)) &&
     (cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,1), cVar1 == ':')) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,2);
    bVar2 = llvm::sys::path::is_separator(cVar1,local_24);
    if (bVar2) {
      return 2;
    }
  }
  sVar5 = llvm::StringRef::size((StringRef *)auStack_20);
  if (3 < sVar5) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,0);
    bVar2 = llvm::sys::path::is_separator(cVar1,local_24);
    if (bVar2) {
      cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,0);
      cVar3 = llvm::StringRef::operator[]((StringRef *)auStack_20,1);
      if (cVar1 == cVar3) {
        cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,2);
        bVar2 = llvm::sys::path::is_separator(cVar1,local_24);
        if (!bVar2) {
          Str = separators(local_24);
          llvm::StringRef::StringRef(&local_38,Str);
          sVar6 = llvm::StringRef::find_first_of((StringRef *)auStack_20,local_38,2);
          return sVar6;
        }
      }
    }
  }
  sVar5 = llvm::StringRef::size((StringRef *)auStack_20);
  if (sVar5 != 0) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,0);
    bVar2 = llvm::sys::path::is_separator(cVar1,local_24);
    if (bVar2) {
      return 0;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t root_dir_start(StringRef str, Style style) {
    // case "c:/"
    if (real_style(style) == Style::windows) {
      if (str.size() > 2 && str[1] == ':' && is_separator(str[2], style))
        return 2;
    }

    // case "//net"
    if (str.size() > 3 && is_separator(str[0], style) && str[0] == str[1] &&
        !is_separator(str[2], style)) {
      return str.find_first_of(separators(style), 2);
    }

    // case "/"
    if (str.size() > 0 && is_separator(str[0], style))
      return 0;

    return StringRef::npos;
  }